

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxFRandom::Emit(FxFRandom *this,VMFunctionBuilder *build)

{
  FScriptPosition *pos;
  _func_int **ptr;
  FxExpression *operand;
  bool bVar1;
  uint uVar2;
  DObject *this_00;
  ulong uVar3;
  ulong uVar4;
  int opb;
  ulong uVar5;
  FName local_34;
  
  this_00 = (DObject *)FindBuiltinFunction(&local_34,BuiltinFRandom);
  bVar1 = DObject::IsKindOf(this_00,PSymbolVMFunction::RegistrationInfo.MyClass);
  if (!bVar1) {
    __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x1514,"virtual ExpEmit FxFRandom::Emit(VMFunctionBuilder *)");
  }
  ptr = this_00[1]._vptr_DObject;
  if (ptr != (_func_int **)0x0) {
    bVar1 = (this->super_FxRandom).EmitTail;
    uVar2 = VMFunctionBuilder::GetConstantAddress(build,(this->super_FxRandom).rng,'\x02');
    VMFunctionBuilder::Emit(build,0x46,0,7,uVar2);
    operand = (this->super_FxRandom).min;
    opb = 1;
    if ((operand != (FxExpression *)0x0) && ((this->super_FxRandom).max != (FxExpression *)0x0)) {
      pos = &(this->super_FxRandom).super_FxExpression.ScriptPosition;
      EmitParameter(build,operand,pos);
      EmitParameter(build,(this->super_FxRandom).max,pos);
      opb = 3;
    }
    uVar2 = VMFunctionBuilder::GetConstantAddress(build,ptr,'\x01');
    VMFunctionBuilder::Emit(build,(uint)bVar1 + (uint)bVar1 * 2 + 0x49,uVar2,opb,1);
    if ((this->super_FxRandom).EmitTail == false) {
      uVar2 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 1,1);
      uVar5 = (ulong)(uVar2 & 0xffff);
      VMFunctionBuilder::Emit(build,0x4d,0,1,uVar2 & 0xffff);
      uVar4 = 0x10000;
      uVar3 = 0x1000000;
    }
    else {
      uVar4 = 0x800000;
      uVar3 = 0x1000001000000;
      uVar5 = 0;
    }
    return (ExpEmit)(uVar3 | uVar4 | uVar5);
  }
  __assert_fail("((PSymbolVMFunction *)sym)->Function != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x1515,"virtual ExpEmit FxFRandom::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxFRandom::Emit(VMFunctionBuilder *build)
{
	// Call the BuiltinFRandom function to generate a floating point random number..
	VMFunction *callfunc;
	PSymbol *sym = FindBuiltinFunction(NAME_BuiltinFRandom, BuiltinFRandom);

	assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction)));
	assert(((PSymbolVMFunction *)sym)->Function != nullptr);
	callfunc = ((PSymbolVMFunction *)sym)->Function;

	int opcode = (EmitTail ? OP_TAIL_K : OP_CALL_K);

	build->Emit(OP_PARAM, 0, REGT_POINTER | REGT_KONST, build->GetConstantAddress(rng, ATAG_RNG));
	if (min != nullptr && max != nullptr)
	{
		EmitParameter(build, min, ScriptPosition);
		EmitParameter(build, max, ScriptPosition);
		build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 3, 1);
	}
	else
	{
		build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 1, 1);
	}

	if (EmitTail)
	{
		ExpEmit call;
		call.Final = true;
		return call;
	}

	ExpEmit out(build, REGT_FLOAT);
	build->Emit(OP_RESULT, 0, REGT_FLOAT, out.RegNum);
	return out;
}